

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

string * absolutename(string *__return_storage_ptr__,string *filename)

{
  const_reference pvVar1;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *filename_local;
  
  local_18 = filename;
  filename_local = __return_storage_ptr__;
  pvVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           operator[](filename,0);
  if (*pvVar1 == '/') {
    std::__cxx11::string::string((string *)__return_storage_ptr__,local_18);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DrLSimon[P]glitter",&local_59
              );
    std::operator+(&local_38,&local_58,"/");
    std::operator+(__return_storage_ptr__,&local_38,local_18);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string absolutename(const std::string & filename)
{
  if (filename[0] == '/') {
    return filename;
  }
  return std::string(RESOURCE_DIR) + "/" + filename;
}